

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
          (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  void **obj;
  SmallHeapBlockBitVector *this_00;
  char *pcVar8;
  void **address;
  uint i;
  uint localObjectBitDelta;
  uint localObjectSize;
  uint localObjectCount;
  Recycler *recycler_local;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  bVar2 = HeapBlock::IsAnyNormalBlock((HeapBlock *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x50,"(this->IsAnyNormalBlock())","this->IsAnyNormalBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar5 = (uint)(this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).objectCount;
  uVar6 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetObjectSize
                    (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
  if (((this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).markCount == uVar5) &&
     (recycler->objectGraphDumper == (RecyclerObjectGraphDumper *)0x0)) {
    obj = (void **)SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddress
                             (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
    Recycler::ScanObjectInlineInterior(recycler,obj,(ulong)(uVar6 * uVar5));
  }
  else if ((this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).markCount != 0) {
    uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetObjectBitDelta
                      (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
    for (address._0_4_ = 0; (uint)address < uVar5; address._0_4_ = (uint)address + 1) {
      this_00 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetMarkedBitVector
                          (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
      BVar3 = BVStatic<256UL>::Test(this_00,(uint)address * uVar4);
      if (BVar3 != '\0') {
        pcVar8 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddress
                           (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::BeginDumpObject(recycler->objectGraphDumper,L"Implicit Root");
        }
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::DumpObjectReference
                    (recycler->objectGraphDumper,pcVar8 + (uint)address * uVar6,false);
        }
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::EndDumpObject(recycler->objectGraphDumper);
        }
        Recycler::ScanObjectInlineInterior
                  (recycler,(void **)(pcVar8 + (uint)address * uVar6),(ulong)uVar6);
      }
    }
  }
  return;
}

Assistant:

void
SmallNormalHeapBlockT<TBlockAttributes>::ScanInitialImplicitRoots(Recycler * recycler)
{
    Assert(this->IsAnyNormalBlock());

    uint const localObjectCount = this->objectCount;
    uint const localObjectSize = this->GetObjectSize();

    // We can use the markCount to optimize the scan because we update it in ResetMark
    if (this->markCount == localObjectCount
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
        && recycler->objectGraphDumper == nullptr
#endif
        )
    {
        // TODO: only interior?
        recycler->ScanObjectInlineInterior((void **)this->GetAddress(), localObjectSize * localObjectCount);
    }
    else if (this->markCount != 0)
    {
        uint const localObjectBitDelta = this->GetObjectBitDelta();
        for (uint i = 0; i < localObjectCount; i++)
        {
            if (this->GetMarkedBitVector()->Test(i * localObjectBitDelta))
            {
                // TODO: only interior?
                void ** address = (void **)(this->GetAddress() + i * localObjectSize);
                DUMP_IMPLICIT_ROOT(recycler, address);
                recycler->ScanObjectInlineInterior(address, localObjectSize);
            }
        }
    }
}